

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O0

void __thiscall
icu_63::SpoofData::SpoofData(SpoofData *this,void *data,int32_t length,UErrorCode *status)

{
  UBool UVar1;
  void *ncData;
  UErrorCode *status_local;
  int32_t length_local;
  void *data_local;
  SpoofData *this_local;
  
  reset(this);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((uint)length < 0x60) {
      *status = U_INVALID_FORMAT_ERROR;
    }
    else if (data == (void *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      this->fRawData = (SpoofDataHeader *)data;
      if (length < this->fRawData->fLength) {
        *status = U_INVALID_FORMAT_ERROR;
      }
      else {
        validateDataVersion(this,status);
        initPtrs(this,status);
      }
    }
  }
  return;
}

Assistant:

SpoofData::SpoofData(const void *data, int32_t length, UErrorCode &status)
{
    reset();
    if (U_FAILURE(status)) {
        return;
    }
    if ((size_t)length < sizeof(SpoofDataHeader)) {
        status = U_INVALID_FORMAT_ERROR;
        return;
    }
    if (data == NULL) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    void *ncData = const_cast<void *>(data);
    fRawData = static_cast<SpoofDataHeader *>(ncData);
    if (length < fRawData->fLength) {
        status = U_INVALID_FORMAT_ERROR;
        return;
    }
    validateDataVersion(status);
    initPtrs(status);
}